

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name,bool is_label)

{
  string_view wasm_name;
  char *pcVar1;
  string_view name_00;
  string_view sVar2;
  char local_a1;
  CWriter *local_90;
  char *local_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  CWriter *local_40;
  char *local_38;
  undefined1 local_29;
  CWriter *pCStack_28;
  bool is_label_local;
  CWriter *this_local;
  string_view name_local;
  
  local_38 = name._M_str;
  local_40 = (CWriter *)name._M_len;
  pcVar1 = (char *)CONCAT71((int7)((ulong)(this + 0x150) >> 8),is_label);
  sVar2._M_str._1_7_ = name._M_len._1_7_;
  sVar2._M_str._0_1_ = 0x6c;
  local_a1 = 'm';
  if (!is_label) {
    local_a1 = 'l';
  }
  sVar2._M_len = (size_t)local_38;
  local_29 = is_label;
  pCStack_28 = this;
  this_local = local_40;
  name_local._M_len = (size_t)local_38;
  name_local._M_str = (char *)__return_storage_ptr__;
  sVar2 = anon_unknown_0::StripLeadingDollar((anon_unknown_0 *)local_40,sVar2);
  local_90 = (CWriter *)sVar2._M_len;
  local_88 = sVar2._M_str;
  name_00._M_str = pcVar1;
  name_00._M_len = (size_t)local_88;
  MangleName_abi_cxx11_(&local_80,local_90,name_00);
  std::operator+(&local_60,"w2c_",&local_80);
  wasm_name._M_str = local_38;
  wasm_name._M_len = (size_t)local_40;
  anon_unknown_0::CWriter::ClaimUniqueName
            (__return_storage_ptr__,(CWriter *)this,(SymbolSet *)(this + 0x150),
             (SymbolMap *)(this + 0x90),local_a1,wasm_name,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::DefineLocalScopeName(std::string_view name,
                                          bool is_label) {
  return ClaimUniqueName(local_syms_, local_sym_map_,
                         is_label ? kLabelSuffix : kParamSuffix, name,
                         kSymbolPrefix + MangleName(StripLeadingDollar(name)));
}